

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,bool fHasEscape,
          bool fHasMultiChar,EncodedCharPtr pchMin,EncodedCharPtr p,EncodedCharPtr *pp)

{
  size_t multiUnits;
  LPCOLESTR prgch;
  code *pcVar1;
  EncodedCharPtr puVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 cch_00;
  tokens tVar5;
  undefined4 *puVar6;
  IdentPtr pid_00;
  byte local_a9;
  byte local_99;
  tokens tk;
  IdentPtr pid;
  tokens tk_1;
  int32 cch;
  size_t multiUnitsBeforeLast;
  EncodedCharPtr pchBeforeLast;
  EncodedCharPtr puStack_38;
  codepoint_t codePoint;
  EncodedCharPtr last;
  EncodedCharPtr p_local;
  EncodedCharPtr pchMin_local;
  bool fHasMultiChar_local;
  bool fHasEscape_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *pSStack_18;
  bool identifyKwds_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  puStack_38 = this->m_pchLast;
  last = p;
  p_local = pchMin;
  pchMin_local._5_1_ = fHasMultiChar;
  pchMin_local._6_1_ = fHasEscape;
  pchMin_local._7_1_ = identifyKwds;
  pSStack_18 = this;
  do {
    BVar4 = FastIdentifierContinue(this,&last,puStack_38);
    puVar2 = last;
    if (BVar4 != 0) goto LAB_015f0d8f;
    pchBeforeLast._4_4_ = 0xffffffff;
    multiUnits = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    bVar3 = TryReadCodePoint<true>
                      (this,&last,puStack_38,(codepoint_t *)((long)&pchBeforeLast + 4),
                       (bool *)((long)&pchMin_local + 6),(bool *)((long)&pchMin_local + 5));
    if (!bVar3) break;
    if (0x10ffff < pchBeforeLast._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1e3,"(codePoint < 0x110000u)","codePoint < 0x110000u");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = Js::CharClassifier::IsIdContinue(this->charClassifier,pchBeforeLast._4_4_);
  } while (bVar3);
  last = puVar2;
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,multiUnits);
LAB_015f0d8f:
  this->field_0x508 = this->field_0x508 & 0xef | (pchMin_local._6_1_ & 1) << 4;
  if (((long)last - (long)p_local < 1) || (0x7fffffff < (long)last - (long)p_local)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x1f2,"(p - pchMin > 0 && p - pchMin <= 2147483647L)",
                       "p - pchMin > 0 && p - pchMin <= LONG_MAX");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  *pp = last;
  if ((pchMin_local._7_1_ & 1) == 0) {
    return tkID;
  }
  if (((pchMin_local._5_1_ & 1) == 0) && ((pchMin_local._6_1_ & 1) == 0)) {
    cch_00 = UnescapeToTempBuf(this,p_local,last);
    prgch = (this->m_tempChBuf).m_prgch;
    bVar3 = IsStrictMode(this);
    tVar5 = Ident::TkFromNameLen(prgch,cch_00,bVar3);
    if (((tVar5 != tkID) && ((tVar5 != tkYIELD || (bVar3 = YieldIsKeyword(this), bVar3)))) &&
       ((tVar5 != tkAWAIT || (bVar3 = AwaitIsKeyword(this), bVar3)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x204,
                         "(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()))"
                         ,
                         "tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword())"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    Token::SetIdentifier((Token *)this->m_ptoken,(char *)p_local,(int)last - (int)p_local);
    return tkID;
  }
  pid_00 = PidOfIdentiferAt(this,p_local,last,(bool)(pchMin_local._6_1_ & 1),
                            (bool)(pchMin_local._5_1_ & 1));
  Token::SetIdentifier((Token *)this->m_ptoken,pid_00);
  if ((pchMin_local._6_1_ & 1) == 0) {
    bVar3 = IsStrictMode(this);
    tVar5 = Ident::Tk(pid_00,bVar3);
    if (tVar5 != tkID) {
      bVar3 = IsStrictMode(this);
      tVar5 = Ident::Tk(pid_00,bVar3);
      if ((tVar5 != tkYIELD) || (bVar3 = YieldIsKeyword(this), bVar3)) {
        bVar3 = IsStrictMode(this);
        tVar5 = Ident::Tk(pid_00,bVar3);
        if ((tVar5 != tkAWAIT) || (bVar3 = AwaitIsKeyword(this), bVar3)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                             ,0x215,
                             "(pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()))"
                             ,
                             "pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword())"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    return tkID;
  }
  bVar3 = IsStrictMode(this);
  tVar5 = Ident::Tk(pid_00,bVar3);
  local_99 = 1;
  if (tVar5 != tkID) {
    if (tVar5 == tkYIELD) {
      bVar3 = YieldIsKeyword(this);
      local_99 = 1;
      if (!bVar3) goto LAB_015f116c;
    }
    local_a9 = 0;
    if (tVar5 == tkAWAIT) {
      bVar3 = AwaitIsKeyword(this);
      local_a9 = bVar3 ^ 0xff;
    }
    local_99 = local_a9;
  }
LAB_015f116c:
  this_local._4_4_ = tkNone;
  if ((local_99 & 1) != 0) {
    this_local._4_4_ = tkID;
  }
  return this_local._4_4_;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifierContinue(bool identifyKwds, bool fHasEscape, bool fHasMultiChar,
    EncodedCharPtr pchMin, EncodedCharPtr p, EncodedCharPtr *pp)
{
    EncodedCharPtr last = m_pchLast;

    while (true)
    {
        // Fast path for utf8, non-multi unit char and not escape
        if (FastIdentifierContinue(p, last))
        {
            break;
        }

        // Slow path that has to deal with multi unit encoding
        codepoint_t codePoint = INVALID_CODEPOINT;
        EncodedCharPtr pchBeforeLast = p;
        size_t multiUnitsBeforeLast = this->m_cMultiUnits;
        if (TryReadCodePoint<true>(p, last, &codePoint, &fHasEscape, &fHasMultiChar))
        {
            Assert(codePoint < 0x110000u);
            if (charClassifier->IsIdContinue(codePoint))
            {
                continue;
            }
        }

        // Put back the last character
        p = pchBeforeLast;
        this->RestoreMultiUnits(multiUnitsBeforeLast);
        break;
    }

    m_lastIdentifierHasEscape = fHasEscape;

    Assert(p - pchMin > 0 && p - pchMin <= LONG_MAX);

    *pp = p;

    if (!identifyKwds)
    {
        return tkID;
    }

    // UTF16 Scanner are only for syntax coloring, so it shouldn't come here.
    if (EncodingPolicy::MultiUnitEncoding && !fHasMultiChar && !fHasEscape)
    {
        Assert(sizeof(EncodedChar) == 1);

        // If there are no escape, that the main scan loop would have found the keyword already
        // So we can just assume it is an ID
        DebugOnly(int32 cch = UnescapeToTempBuf(pchMin, p));
        DebugOnly(tokens tk = Ident::TkFromNameLen(m_tempChBuf.m_prgch, cch, IsStrictMode()));
        Assert(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()));

        m_ptoken->SetIdentifier(reinterpret_cast<const char *>(pchMin), (int32)(p - pchMin));
        return tkID;
    }

    IdentPtr pid = PidOfIdentiferAt(pchMin, p, fHasEscape, fHasMultiChar);
    m_ptoken->SetIdentifier(pid);

    if (!fHasEscape)
    {
        // If it doesn't have escape, then Scan() should have taken care of keywords (except
        // yield if m_fYieldIsKeyword is false, in which case yield is treated as an identifier, and except
        // await if m_fAwaitIsKeyword is false, in which case await is treated as an identifier).
        // We don't have to check if the name is reserved word and return it as an Identifier
        Assert(pid->Tk(IsStrictMode()) == tkID
            || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword())
            || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()));
        return tkID;
    }
    tokens tk = pid->Tk(IsStrictMode());
    return tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()) ? tkID : tkNone;
}